

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateSetDictionary(z_stream *strm,uint8_t *dictionary,uint32_t dictLength)

{
  uint32_t uVar1;
  deflate_state *s_00;
  uchar *puVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uchar *next;
  uint32_t avail;
  int wrap;
  uint n;
  uint str;
  deflate_state *s;
  uint8_t *puStack_20;
  uint32_t dictLength_local;
  uint8_t *dictionary_local;
  z_stream *strm_local;
  
  iVar3 = deflateStateCheck(strm);
  if ((iVar3 == 0) && (dictionary != (uint8_t *)0x0)) {
    s_00 = strm->state;
    iVar3 = s_00->wrap;
    if ((iVar3 == 2) || (((iVar3 == 1 && (s_00->status != 1)) || (s_00->lookahead != 0)))) {
      strm_local._4_4_ = -2;
    }
    else {
      if (iVar3 == 1) {
        uVar4 = adler32_c((uint32_t)strm->adler,dictionary,(ulong)dictLength);
        strm->adler = (ulong)uVar4;
      }
      s_00->wrap = 0;
      s._4_4_ = dictLength;
      puStack_20 = dictionary;
      if (s_00->w_size <= dictLength) {
        if (iVar3 == 0) {
          memset(s_00->head,0,0x20000);
          s_00->strstart = 0;
          s_00->block_start = 0;
          s_00->insert = 0;
        }
        puStack_20 = dictionary + (dictLength - s_00->w_size);
        s._4_4_ = s_00->w_size;
      }
      uVar4 = strm->avail_in;
      puVar2 = strm->next_in;
      strm->avail_in = s._4_4_;
      strm->next_in = puStack_20;
      fill_window(s_00);
      while (2 < s_00->lookahead) {
        uVar1 = s_00->strstart;
        uVar5 = s_00->lookahead - 2;
        (*s_00->insert_string)(s_00,uVar1,uVar5);
        s_00->strstart = uVar1 + uVar5;
        s_00->lookahead = 2;
        fill_window(s_00);
      }
      s_00->strstart = s_00->lookahead + s_00->strstart;
      s_00->block_start = s_00->strstart;
      s_00->insert = s_00->lookahead;
      s_00->lookahead = 0;
      s_00->prev_length = 0;
      s_00->match_available = 0;
      strm->next_in = puVar2;
      strm->avail_in = uVar4;
      s_00->wrap = iVar3;
      strm_local._4_4_ = 0;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateSetDictionary)(PREFIX3(stream) *strm, const uint8_t *dictionary, uint32_t dictLength) {
    deflate_state *s;
    unsigned int str, n;
    int wrap;
    uint32_t avail;
    const unsigned char *next;

    if (deflateStateCheck(strm) || dictionary == NULL)
        return Z_STREAM_ERROR;
    s = strm->state;
    wrap = s->wrap;
    if (wrap == 2 || (wrap == 1 && s->status != INIT_STATE) || s->lookahead)
        return Z_STREAM_ERROR;

    /* when using zlib wrappers, compute Adler-32 for provided dictionary */
    if (wrap == 1)
        strm->adler = FUNCTABLE_CALL(adler32)(strm->adler, dictionary, dictLength);
    DEFLATE_SET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */
    s->wrap = 0;                    /* avoid computing Adler-32 in read_buf */

    /* if dictionary would fill window, just replace the history */
    if (dictLength >= s->w_size) {
        if (wrap == 0) {            /* already empty otherwise */
            CLEAR_HASH(s);
            s->strstart = 0;
            s->block_start = 0;
            s->insert = 0;
        }
        dictionary += dictLength - s->w_size;  /* use the tail */
        dictLength = s->w_size;
    }

    /* insert dictionary into window and hash */
    avail = strm->avail_in;
    next = strm->next_in;
    strm->avail_in = dictLength;
    strm->next_in = (z_const unsigned char *)dictionary;
    PREFIX(fill_window)(s);
    while (s->lookahead >= STD_MIN_MATCH) {
        str = s->strstart;
        n = s->lookahead - (STD_MIN_MATCH - 1);
        s->insert_string(s, str, n);
        s->strstart = str + n;
        s->lookahead = STD_MIN_MATCH - 1;
        PREFIX(fill_window)(s);
    }
    s->strstart += s->lookahead;
    s->block_start = (int)s->strstart;
    s->insert = s->lookahead;
    s->lookahead = 0;
    s->prev_length = 0;
    s->match_available = 0;
    strm->next_in = (z_const unsigned char *)next;
    strm->avail_in = avail;
    s->wrap = wrap;
    return Z_OK;
}